

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vtabCallConstructor(sqlite3 *db,Table *pTab,Module *pMod,
                       _func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                       *xConstruct,char **pzErr)

{
  int iVar1;
  char **ppcVar2;
  Schema *pSVar3;
  sqlite3_vtab *psVar4;
  byte bVar5;
  int iVar6;
  VtabCtx *pVVar7;
  VTable *pVTab;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  Schema **ppSVar15;
  char *pcVar16;
  long lVar17;
  ulong uVar18;
  char *zErr;
  VtabCtx sCtx;
  Column *local_88;
  short local_78;
  char *local_58;
  VtabCtx local_50;
  
  ppcVar2 = pTab->azModuleArg;
  iVar1 = pTab->nModuleArg;
  local_58 = (char *)0x0;
  for (pVVar7 = db->pVtabCtx; pVVar7 != (VtabCtx *)0x0; pVVar7 = pVVar7->pPrior) {
    if (pVVar7->pTab == pTab) {
      pcVar8 = sqlite3MPrintf(db,"vtable constructor called recursively: %s",pTab->zName);
      *pzErr = pcVar8;
      return 6;
    }
  }
  pcVar8 = sqlite3DbStrDup(db,pTab->zName);
  iVar6 = 7;
  if (pcVar8 != (char *)0x0) {
    pVTab = (VTable *)sqlite3Malloc(0x30);
    if (pVTab == (VTable *)0x0) {
      sqlite3OomFault(db);
      iVar6 = 7;
    }
    else {
      *(undefined8 *)&pVTab->iSavepoint = 0;
      pVTab->pNext = (VTable *)0x0;
      pVTab->pVtab = (sqlite3_vtab *)0x0;
      pVTab->nRef = 0;
      pVTab->bConstraint = '\0';
      *(undefined3 *)&pVTab->field_0x1d = 0;
      pVTab->db = db;
      pVTab->pMod = pMod;
      if (pTab->pSchema == (Schema *)0x0) {
        lVar12 = -1000000;
      }
      else {
        lVar12 = -0x100000000;
        ppSVar15 = &db->aDb->pSchema;
        do {
          lVar12 = lVar12 + 0x100000000;
          pSVar3 = *ppSVar15;
          ppSVar15 = ppSVar15 + 4;
        } while (pSVar3 != pTab->pSchema);
        lVar12 = lVar12 >> 0x20;
      }
      pTab->azModuleArg[1] = db->aDb[lVar12].zDbSName;
      local_50.pPrior = db->pVtabCtx;
      local_50.bDeclared = 0;
      db->pVtabCtx = &local_50;
      local_50.pVTable = pVTab;
      local_50.pTab = pTab;
      iVar6 = (*xConstruct)(db,pMod->pAux,iVar1,ppcVar2,&pVTab->pVtab,&local_58);
      db->pVtabCtx = local_50.pPrior;
      if (iVar6 == 0) {
        psVar4 = pVTab->pVtab;
        iVar6 = 0;
        if (psVar4 != (sqlite3_vtab *)0x0) {
          psVar4->pModule = (sqlite3_module *)0x0;
          *(undefined8 *)&psVar4->nRef = 0;
          psVar4->zErrMsg = (char *)0x0;
          pVTab->pVtab->pModule = pMod->pModule;
          pVTab->nRef = 1;
          if (local_50.bDeclared == 0) {
            pcVar9 = sqlite3MPrintf(db,"vtable constructor did not declare schema: %s",pTab->zName);
            *pzErr = pcVar9;
            sqlite3VtabUnlock(pVTab);
            iVar6 = 1;
          }
          else {
            pVTab->pNext = pTab->pVTable;
            pTab->pVTable = pVTab;
            local_78 = pTab->nCol;
            if (0 < local_78) {
              local_88 = pTab->aCol;
              lVar12 = 0;
              bVar5 = 0;
              do {
                pcVar9 = "";
                if ((local_88[lVar12].colFlags & 4) != 0) {
                  pcVar9 = local_88[lVar12].zName;
                  sVar10 = strlen(pcVar9);
                  pcVar9 = pcVar9 + sVar10 + 1;
                }
                sVar10 = strlen(pcVar9);
                if ((sVar10 & 0x3fffffff) != 0) {
                  uVar11 = (ulong)((uint)sVar10 & 0x3fffffff);
                  uVar13 = 0;
                  pcVar16 = pcVar9;
LAB_0015630c:
                  lVar17 = 0;
                  do {
                    if (""[(byte)"hidden"[lVar17]] != ""[(byte)pcVar16[lVar17]]) goto LAB_00156344;
                    lVar17 = lVar17 + 1;
                  } while (lVar17 != 6);
                  if (((uVar13 != 0) && (pcVar9[uVar13 - 1] != ' ')) ||
                     ((pcVar9[uVar13 + 6] & 0xdfU) != 0)) goto LAB_00156344;
                  uVar14 = 7 - (pcVar9[uVar13 + 6] == 0);
                  uVar18 = uVar13;
                  if (uVar14 + (int)uVar13 <= ((uint)sVar10 & 0x3fffffff)) {
                    do {
                      pcVar9[uVar18] = pcVar9[uVar18 + uVar14];
                      lVar17 = uVar14 + uVar18;
                      uVar18 = uVar18 + 1;
                    } while (lVar17 + 1U <= uVar11);
                  }
                  if ((uVar13 != 0) && (pcVar9[uVar13] == '\0')) {
                    pcVar9[uVar13 - 1] = '\0';
                  }
                  local_88 = pTab->aCol;
                  local_88[lVar12].colFlags = local_88[lVar12].colFlags | 2;
                  local_78 = pTab->nCol;
                  bVar5 = 0x80;
                  goto LAB_001563bd;
                }
LAB_0015634f:
                pTab->tabFlags = pTab->tabFlags | (uint)bVar5;
LAB_001563bd:
                lVar12 = lVar12 + 1;
              } while (lVar12 < local_78);
              iVar6 = 0;
            }
          }
        }
      }
      else {
        if (iVar6 == 7) {
          sqlite3OomFault(db);
        }
        if (local_58 == (char *)0x0) {
          pcVar9 = sqlite3MPrintf(db,"vtable constructor failed: %s",pcVar8);
          *pzErr = pcVar9;
        }
        else {
          pcVar9 = sqlite3MPrintf(db,"%s");
          *pzErr = pcVar9;
          sqlite3_free(local_58);
        }
        sqlite3DbFreeNN(db,pVTab);
      }
    }
    sqlite3DbFreeNN(db,pcVar8);
  }
  return iVar6;
LAB_00156344:
  uVar13 = uVar13 + 1;
  pcVar16 = pcVar16 + 1;
  if (uVar13 == uVar11) goto LAB_0015634f;
  goto LAB_0015630c;
}

Assistant:

static int vtabCallConstructor(
  sqlite3 *db, 
  Table *pTab,
  Module *pMod,
  int (*xConstruct)(sqlite3*,void*,int,const char*const*,sqlite3_vtab**,char**),
  char **pzErr
){
  VtabCtx sCtx;
  VTable *pVTable;
  int rc;
  const char *const*azArg = (const char *const*)pTab->azModuleArg;
  int nArg = pTab->nModuleArg;
  char *zErr = 0;
  char *zModuleName;
  int iDb;
  VtabCtx *pCtx;

  /* Check that the virtual-table is not already being initialized */
  for(pCtx=db->pVtabCtx; pCtx; pCtx=pCtx->pPrior){
    if( pCtx->pTab==pTab ){
      *pzErr = sqlite3MPrintf(db, 
          "vtable constructor called recursively: %s", pTab->zName
      );
      return SQLITE_LOCKED;
    }
  }

  zModuleName = sqlite3DbStrDup(db, pTab->zName);
  if( !zModuleName ){
    return SQLITE_NOMEM_BKPT;
  }

  pVTable = sqlite3MallocZero(sizeof(VTable));
  if( !pVTable ){
    sqlite3OomFault(db);
    sqlite3DbFree(db, zModuleName);
    return SQLITE_NOMEM_BKPT;
  }
  pVTable->db = db;
  pVTable->pMod = pMod;

  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  pTab->azModuleArg[1] = db->aDb[iDb].zDbSName;

  /* Invoke the virtual table constructor */
  assert( &db->pVtabCtx );
  assert( xConstruct );
  sCtx.pTab = pTab;
  sCtx.pVTable = pVTable;
  sCtx.pPrior = db->pVtabCtx;
  sCtx.bDeclared = 0;
  db->pVtabCtx = &sCtx;
  rc = xConstruct(db, pMod->pAux, nArg, azArg, &pVTable->pVtab, &zErr);
  db->pVtabCtx = sCtx.pPrior;
  if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
  assert( sCtx.pTab==pTab );

  if( SQLITE_OK!=rc ){
    if( zErr==0 ){
      *pzErr = sqlite3MPrintf(db, "vtable constructor failed: %s", zModuleName);
    }else {
      *pzErr = sqlite3MPrintf(db, "%s", zErr);
      sqlite3_free(zErr);
    }
    sqlite3DbFree(db, pVTable);
  }else if( ALWAYS(pVTable->pVtab) ){
    /* Justification of ALWAYS():  A correct vtab constructor must allocate
    ** the sqlite3_vtab object if successful.  */
    memset(pVTable->pVtab, 0, sizeof(pVTable->pVtab[0]));
    pVTable->pVtab->pModule = pMod->pModule;
    pVTable->nRef = 1;
    if( sCtx.bDeclared==0 ){
      const char *zFormat = "vtable constructor did not declare schema: %s";
      *pzErr = sqlite3MPrintf(db, zFormat, pTab->zName);
      sqlite3VtabUnlock(pVTable);
      rc = SQLITE_ERROR;
    }else{
      int iCol;
      u8 oooHidden = 0;
      /* If everything went according to plan, link the new VTable structure
      ** into the linked list headed by pTab->pVTable. Then loop through the 
      ** columns of the table to see if any of them contain the token "hidden".
      ** If so, set the Column COLFLAG_HIDDEN flag and remove the token from
      ** the type string.  */
      pVTable->pNext = pTab->pVTable;
      pTab->pVTable = pVTable;

      for(iCol=0; iCol<pTab->nCol; iCol++){
        char *zType = sqlite3ColumnType(&pTab->aCol[iCol], "");
        int nType;
        int i = 0;
        nType = sqlite3Strlen30(zType);
        for(i=0; i<nType; i++){
          if( 0==sqlite3StrNICmp("hidden", &zType[i], 6)
           && (i==0 || zType[i-1]==' ')
           && (zType[i+6]=='\0' || zType[i+6]==' ')
          ){
            break;
          }
        }
        if( i<nType ){
          int j;
          int nDel = 6 + (zType[i+6] ? 1 : 0);
          for(j=i; (j+nDel)<=nType; j++){
            zType[j] = zType[j+nDel];
          }
          if( zType[i]=='\0' && i>0 ){
            assert(zType[i-1]==' ');
            zType[i-1] = '\0';
          }
          pTab->aCol[iCol].colFlags |= COLFLAG_HIDDEN;
          oooHidden = TF_OOOHidden;
        }else{
          pTab->tabFlags |= oooHidden;
        }
      }
    }
  }

  sqlite3DbFree(db, zModuleName);
  return rc;
}